

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_filter_by_ext.c
# Opt level: O0

int cmpsuff(char *str,char *suffix)

{
  size_t sVar1;
  size_t sVar2;
  size_t length_suffix;
  size_t length_str;
  char *suffix_local;
  char *str_local;
  
  if ((str == (char *)0x0) || (suffix == (char *)0x0)) {
    str_local._4_4_ = -1;
  }
  else {
    sVar1 = strlen(str);
    sVar2 = strlen(suffix);
    if (sVar1 < sVar2) {
      str_local._4_4_ = -1;
    }
    else {
      str_local._4_4_ = strcmp(str + (sVar1 - sVar2),suffix);
    }
  }
  return str_local._4_4_;
}

Assistant:

static 
int cmpsuff(const char *str, const char *suffix)
{
  size_t length_str, length_suffix;

  if ((str == NULL) || (suffix == NULL))
    return -1;

  length_str = strlen(str);
  length_suffix = strlen(suffix);

  if (length_str >= length_suffix) {
    return strcmp(str + (length_str - length_suffix), suffix);
  } else {
    return -1;
  }
}